

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void cmGlobalNinjaGenerator::WriteVariable
               (ostream *os,string *name,string *value,string *comment,int indent)

{
  ostream *poVar1;
  string_view str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string val;
  string local_68;
  string local_48;
  
  if (name->_M_string_length == 0) {
    local_68.field_2._8_8_ = (comment->_M_dataplus)._M_p;
    local_68.field_2._M_allocated_capacity = comment->_M_string_length;
    local_68._M_dataplus._M_p = (char *)0x36;
    local_68._M_string_length = 0x716af1;
    views._M_len = 2;
    views._M_array = (iterator)&local_68;
    cmCatViews_abi_cxx11_(&local_48,views);
    cmSystemTools::Error(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
  }
  else {
    str._M_str = (value->_M_dataplus)._M_p;
    str._M_len = value->_M_string_length;
    cmTrimWhitespace_abi_cxx11_(&local_68,str);
    if ((char *)local_68._M_string_length != (char *)0x0) {
      WriteComment(os,comment);
      Indent(os,indent);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    }
    local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteVariable(std::ostream& os,
                                           const std::string& name,
                                           const std::string& value,
                                           const std::string& comment,
                                           int indent)
{
  // Make sure we have a name.
  if (name.empty()) {
    cmSystemTools::Error(cmStrCat("No name given for WriteVariable! called "
                                  "with comment: ",
                                  comment));
    return;
  }

  // Do not add a variable if the value is empty.
  std::string val = cmTrimWhitespace(value);
  if (val.empty()) {
    return;
  }

  cmGlobalNinjaGenerator::WriteComment(os, comment);
  cmGlobalNinjaGenerator::Indent(os, indent);
  os << name << " = " << val << "\n";
}